

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O2

string * __thiscall
cmQtAutoGeneratorMocUic::JobParseT::MocFindIncludedHeader
          (string *__return_storage_ptr__,JobParseT *this,WorkerT *wrk,string *includerDir,
          string *includeBase)

{
  cmQtAutoGeneratorMocUic *pcVar1;
  pointer pbVar2;
  bool bVar3;
  string *path;
  pointer pbVar4;
  string fullPath;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = wrk->Gen_;
  std::operator+(&fullPath,includerDir,includeBase);
  bVar3 = BaseSettingsT::FindHeader(&pcVar1->Base_,__return_storage_ptr__,&fullPath);
  std::__cxx11::string::~string((string *)&fullPath);
  if (!bVar3) {
    pbVar4 = (wrk->Gen_->Moc_).IncludePaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (wrk->Gen_->Moc_).IncludePaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pbVar4 == pbVar2) break;
      std::__cxx11::string::string((string *)&fullPath,(string *)pbVar4);
      std::__cxx11::string::push_back((char)&fullPath);
      std::__cxx11::string::append((string *)&fullPath);
      bVar3 = BaseSettingsT::FindHeader(&wrk->Gen_->Base_,__return_storage_ptr__,&fullPath);
      std::__cxx11::string::~string((string *)&fullPath);
      pbVar4 = pbVar4 + 1;
    } while (!bVar3);
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    cmQtAutoGenerator::FileSystem::GetRealPath
              (&fullPath,&(wrk->Gen_->super_cmQtAutoGenerator).FileSys_,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&fullPath);
    std::__cxx11::string::~string((string *)&fullPath);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGeneratorMocUic::JobParseT::MocFindIncludedHeader(
  WorkerT& wrk, std::string const& includerDir, std::string const& includeBase)
{
  std::string header;
  // Search in vicinity of the source
  if (!wrk.Base().FindHeader(header, includerDir + includeBase)) {
    // Search in include directories
    for (std::string const& path : wrk.Moc().IncludePaths) {
      std::string fullPath = path;
      fullPath.push_back('/');
      fullPath += includeBase;
      if (wrk.Base().FindHeader(header, fullPath)) {
        break;
      }
    }
  }
  // Sanitize
  if (!header.empty()) {
    header = wrk.FileSys().GetRealPath(header);
  }
  return header;
}